

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void Transform_SSE2(int16_t *in,uint8_t *dst,int do_two)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  longlong lVar26;
  longlong lVar27;
  ulong uVar28;
  ulong uVar29;
  longlong lVar30;
  longlong lVar31;
  ulong uVar32;
  ulong uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  ulong uVar36;
  ulong uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  ulong uVar40;
  ulong uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined8 uVar48;
  undefined8 uVar49;
  ulong uVar50;
  ulong uVar51;
  ulong uVar52;
  ulong uVar53;
  int in_EDX;
  ulong *in_RSI;
  undefined8 *in_RDI;
  short sVar54;
  short sVar59;
  short sVar61;
  short sVar63;
  short sVar65;
  short sVar67;
  short sVar72;
  short sVar73;
  short sVar78;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  short sVar55;
  short sVar60;
  short sVar62;
  short sVar64;
  short sVar66;
  short sVar68;
  short sVar69;
  short sVar70;
  short sVar71;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  undefined1 auVar58 [16];
  short sVar84;
  __m128i dst3;
  __m128i dst2;
  __m128i dst1;
  __m128i dst0;
  __m128i zero;
  __m128i shifted3;
  __m128i shifted2;
  __m128i shifted1;
  __m128i shifted0;
  __m128i tmp3_1;
  __m128i tmp2_1;
  __m128i tmp1_1;
  __m128i tmp0_1;
  __m128i d_1;
  __m128i d4_1;
  __m128i d3_1;
  __m128i d2_1;
  __m128i d1_1;
  __m128i c_1;
  __m128i c4_1;
  __m128i c3_1;
  __m128i c2_1;
  __m128i c1_1;
  __m128i b_1;
  __m128i a_1;
  __m128i dc;
  __m128i four;
  __m128i tmp3;
  __m128i tmp2;
  __m128i tmp1;
  __m128i tmp0;
  __m128i d;
  __m128i d4;
  __m128i d3;
  __m128i d2;
  __m128i d1;
  __m128i c;
  __m128i c4;
  __m128i c3;
  __m128i c2;
  __m128i c1;
  __m128i b;
  __m128i a;
  __m128i inB3;
  __m128i inB2;
  __m128i inB1;
  __m128i inB0;
  __m128i in3;
  __m128i in2;
  __m128i in1;
  __m128i in0;
  __m128i T3;
  __m128i T2;
  __m128i T1;
  __m128i T0;
  __m128i k2;
  __m128i k1;
  __m128i *in_stack_fffffffffffff208;
  __m128i *in1_00;
  __m128i *in0_00;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined8 local_db8;
  undefined8 uStack_db0;
  undefined8 local_da8;
  undefined8 uStack_da0;
  undefined8 local_d98;
  undefined8 uStack_d90;
  undefined8 local_cc8;
  undefined8 uStack_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 local_c68;
  undefined8 uStack_c60;
  undefined2 in_stack_fffffffffffff3b0;
  undefined2 in_stack_fffffffffffff3b2;
  undefined2 in_stack_fffffffffffff3b4;
  undefined2 in_stack_fffffffffffff3b6;
  undefined2 in_stack_fffffffffffff3b8;
  undefined2 in_stack_fffffffffffff3ba;
  undefined2 in_stack_fffffffffffff3bc;
  undefined2 in_stack_fffffffffffff3be;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 uStack_ad0;
  undefined8 uStack_ac0;
  undefined8 uStack_ab0;
  undefined8 uStack_aa0;
  longlong local_a98;
  longlong lStack_a90;
  longlong local_a88;
  longlong lStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  int local_a34;
  ulong *local_a30;
  undefined2 local_a1e;
  undefined2 local_a1c;
  undefined2 local_a1a;
  ulong local_a18;
  undefined8 uStack_a10;
  ulong *local_a00;
  ulong local_9f8;
  undefined8 uStack_9f0;
  ulong *local_9e0;
  ulong local_9d8;
  undefined8 uStack_9d0;
  ulong *local_9c0;
  ulong local_9b8;
  undefined8 uStack_9b0;
  ulong *local_9a0;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 *local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 *local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 *local_920;
  undefined8 local_918;
  undefined8 uStack_910;
  undefined8 *local_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 *local_8e0;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 *local_8c0;
  undefined8 local_8b8;
  undefined8 uStack_8b0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 local_888;
  undefined8 uStack_880;
  undefined8 local_878;
  undefined8 uStack_870;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 local_858;
  undefined8 uStack_850;
  undefined8 local_848;
  undefined8 uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  longlong local_718;
  longlong lStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  undefined8 local_6e8;
  undefined8 uStack_6e0;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  longlong local_538;
  longlong lStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  longlong local_468;
  longlong lStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  longlong local_428;
  longlong lStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined4 local_36c;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined4 local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined4 local_32c;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined4 local_30c;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined1 local_2e8 [16];
  uint32_t local_2cc;
  undefined1 local_2c8 [16];
  uint32_t local_2ac;
  undefined1 local_2a8 [16];
  uint32_t local_28c;
  undefined1 local_288 [16];
  uint32_t local_26c;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  ulong local_e8;
  undefined8 uStack_e0;
  ulong local_d8;
  undefined8 uStack_d0;
  ulong local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  ulong local_88;
  undefined8 uStack_80;
  ulong local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined2 local_58;
  undefined2 local_56;
  undefined2 local_54;
  undefined2 local_52;
  undefined2 local_50;
  undefined2 local_4e;
  undefined2 local_4c;
  undefined2 local_4a;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined2 local_38;
  undefined2 local_36;
  undefined2 local_34;
  undefined2 local_32;
  undefined2 local_30;
  undefined2 local_2e;
  undefined2 local_2c;
  undefined2 local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_a1a = 0x4e7b;
  local_4a = 0x4e7b;
  local_4c = 0x4e7b;
  local_4e = 0x4e7b;
  local_50 = 0x4e7b;
  local_52 = 0x4e7b;
  local_54 = 0x4e7b;
  local_56 = 0x4e7b;
  local_58 = 0x4e7b;
  local_a48 = 0x4e7b4e7b4e7b4e7b;
  uStack_a40 = 0x4e7b4e7b4e7b4e7b;
  local_a1c = 0x8a8c;
  local_2a = 0x8a8c;
  local_2c = 0x8a8c;
  local_2e = 0x8a8c;
  local_30 = 0x8a8c;
  local_32 = 0x8a8c;
  local_34 = 0x8a8c;
  local_36 = 0x8a8c;
  local_38 = 0x8a8c;
  local_a58 = 0x8a8c8a8c8a8c8a8c;
  uStack_a50 = 0x8a8c8a8c8a8c8a8c;
  local_8b8 = *in_RDI;
  uStack_8b0 = 0;
  uStack_aa0 = 0;
  local_8c0 = in_RDI + 1;
  local_8d8 = *local_8c0;
  uStack_8d0 = 0;
  uStack_ab0 = 0;
  local_8e0 = in_RDI + 2;
  local_8f8 = *local_8e0;
  uStack_8f0 = 0;
  uStack_ac0 = 0;
  local_900 = in_RDI + 3;
  local_918 = *local_900;
  uStack_910 = 0;
  uStack_ad0 = 0;
  if (in_EDX != 0) {
    local_920 = in_RDI + 4;
    uStack_aa0 = *local_920;
    uStack_930 = 0;
    local_940 = in_RDI + 5;
    uStack_ab0 = *local_940;
    uStack_950 = 0;
    local_960 = in_RDI + 6;
    uStack_ac0 = *local_960;
    uStack_970 = 0;
    local_980 = in_RDI + 7;
    uStack_ad0 = *local_980;
    uStack_990 = 0;
    uStack_820 = 0;
    uStack_830 = 0;
    uStack_840 = 0;
    uStack_850 = 0;
    uStack_860 = 0;
    uStack_870 = 0;
    uStack_880 = 0;
    uStack_890 = 0;
    local_998 = uStack_ad0;
    local_978 = uStack_ac0;
    local_958 = uStack_ab0;
    local_938 = uStack_aa0;
    local_898 = uStack_ad0;
    local_888 = local_918;
    local_878 = uStack_ac0;
    local_868 = local_8f8;
    local_858 = uStack_ab0;
    local_848 = local_8d8;
    local_838 = uStack_aa0;
    local_828 = local_8b8;
  }
  uStack_5c0 = uStack_aa0;
  uVar43 = uStack_5c0;
  uStack_5d0 = uStack_ac0;
  uVar42 = uStack_5d0;
  local_5c8._0_2_ = (short)local_8b8;
  local_5c8._2_2_ = (short)((ulong)local_8b8 >> 0x10);
  local_5c8._4_2_ = (short)((ulong)local_8b8 >> 0x20);
  local_5c8._6_2_ = (short)((ulong)local_8b8 >> 0x30);
  uStack_5c0._0_2_ = (short)uStack_aa0;
  uStack_5c0._2_2_ = (short)((ulong)uStack_aa0 >> 0x10);
  uStack_5c0._4_2_ = (short)((ulong)uStack_aa0 >> 0x20);
  uStack_5c0._6_2_ = (short)((ulong)uStack_aa0 >> 0x30);
  local_5d8._0_2_ = (short)local_8f8;
  local_5d8._2_2_ = (short)((ulong)local_8f8 >> 0x10);
  local_5d8._4_2_ = (short)((ulong)local_8f8 >> 0x20);
  local_5d8._6_2_ = (short)((ulong)local_8f8 >> 0x30);
  uStack_5d0._0_2_ = (short)uStack_ac0;
  uStack_5d0._2_2_ = (short)((ulong)uStack_ac0 >> 0x10);
  uStack_5d0._4_2_ = (short)((ulong)uStack_ac0 >> 0x20);
  uStack_5d0._6_2_ = (short)((ulong)uStack_ac0 >> 0x30);
  uStack_480 = uStack_aa0;
  uStack_490 = uStack_ac0;
  uStack_380 = uStack_ab0;
  auVar13._8_8_ = uStack_ab0;
  auVar13._0_8_ = local_8d8;
  auVar12._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar12._0_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar56 = pmulhw(auVar13,auVar12);
  uStack_3a0 = uStack_ad0;
  auVar11._8_8_ = uStack_ad0;
  auVar11._0_8_ = local_918;
  auVar10._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar10._0_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar57 = pmulhw(auVar11,auVar10);
  uStack_4a0 = uStack_ab0;
  uVar49 = uStack_4a0;
  uStack_4b0 = uStack_ad0;
  uVar48 = uStack_4b0;
  local_4a8._0_2_ = (short)local_8d8;
  local_4a8._2_2_ = (short)((ulong)local_8d8 >> 0x10);
  local_4a8._4_2_ = (short)((ulong)local_8d8 >> 0x20);
  local_4a8._6_2_ = (short)((ulong)local_8d8 >> 0x30);
  uStack_4a0._0_2_ = (short)uStack_ab0;
  uStack_4a0._2_2_ = (short)((ulong)uStack_ab0 >> 0x10);
  uStack_4a0._4_2_ = (short)((ulong)uStack_ab0 >> 0x20);
  uStack_4a0._6_2_ = (short)((ulong)uStack_ab0 >> 0x30);
  local_4b8._0_2_ = (short)local_918;
  local_4b8._2_2_ = (short)((ulong)local_918 >> 0x10);
  local_4b8._4_2_ = (short)((ulong)local_918 >> 0x20);
  local_4b8._6_2_ = (short)((ulong)local_918 >> 0x30);
  uStack_4b0._0_2_ = (short)uStack_ad0;
  uStack_4b0._2_2_ = (short)((ulong)uStack_ad0 >> 0x10);
  uStack_4b0._4_2_ = (short)((ulong)uStack_ad0 >> 0x20);
  uStack_4b0._6_2_ = (short)((ulong)uStack_ad0 >> 0x30);
  local_b48 = auVar56._0_8_;
  uStack_b40 = auVar56._8_8_;
  local_b58 = auVar57._0_8_;
  uStack_b50 = auVar57._8_8_;
  local_4c8 = local_b48;
  uVar46 = local_4c8;
  uStack_4c0 = uStack_b40;
  uVar47 = uStack_4c0;
  local_4d8 = local_b58;
  uVar44 = local_4d8;
  uStack_4d0 = uStack_b50;
  uVar45 = uStack_4d0;
  local_4c8._0_2_ = auVar56._0_2_;
  local_4c8._2_2_ = auVar56._2_2_;
  local_4c8._4_2_ = auVar56._4_2_;
  local_4c8._6_2_ = auVar56._6_2_;
  uStack_4c0._0_2_ = auVar56._8_2_;
  uStack_4c0._2_2_ = auVar56._10_2_;
  uStack_4c0._4_2_ = auVar56._12_2_;
  uStack_4c0._6_2_ = auVar56._14_2_;
  local_4d8._0_2_ = auVar57._0_2_;
  local_4d8._2_2_ = auVar57._2_2_;
  local_4d8._4_2_ = auVar57._4_2_;
  local_4d8._6_2_ = auVar57._6_2_;
  uStack_4d0._0_2_ = auVar57._8_2_;
  uStack_4d0._2_2_ = auVar57._10_2_;
  uStack_4d0._4_2_ = auVar57._12_2_;
  uStack_4d0._6_2_ = auVar57._14_2_;
  local_5e8 = CONCAT26(local_4a8._6_2_ - local_4b8._6_2_,
                       CONCAT24(local_4a8._4_2_ - local_4b8._4_2_,
                                CONCAT22(local_4a8._2_2_ - local_4b8._2_2_,
                                         (short)local_4a8 - (short)local_4b8)));
  uStack_5e0 = CONCAT26(uStack_4a0._6_2_ - uStack_4b0._6_2_,
                        CONCAT24(uStack_4a0._4_2_ - uStack_4b0._4_2_,
                                 CONCAT22(uStack_4a0._2_2_ - uStack_4b0._2_2_,
                                          (short)uStack_4a0 - (short)uStack_4b0)));
  local_5f8 = CONCAT26(local_4c8._6_2_ - local_4d8._6_2_,
                       CONCAT24(local_4c8._4_2_ - local_4d8._4_2_,
                                CONCAT22(local_4c8._2_2_ - local_4d8._2_2_,
                                         (short)local_4c8 - (short)local_4d8)));
  uStack_5f0 = CONCAT26(uStack_4c0._6_2_ - uStack_4d0._6_2_,
                        CONCAT24(uStack_4c0._4_2_ - uStack_4d0._4_2_,
                                 CONCAT22(uStack_4c0._2_2_ - uStack_4d0._2_2_,
                                          (short)uStack_4c0 - (short)uStack_4d0)));
  sVar54 = ((short)local_4a8 - (short)local_4b8) + ((short)local_4c8 - (short)local_4d8);
  sVar59 = (local_4a8._2_2_ - local_4b8._2_2_) + (local_4c8._2_2_ - local_4d8._2_2_);
  sVar61 = (local_4a8._4_2_ - local_4b8._4_2_) + (local_4c8._4_2_ - local_4d8._4_2_);
  sVar63 = (local_4a8._6_2_ - local_4b8._6_2_) + (local_4c8._6_2_ - local_4d8._6_2_);
  sVar65 = ((short)uStack_4a0 - (short)uStack_4b0) + ((short)uStack_4c0 - (short)uStack_4d0);
  sVar67 = (uStack_4a0._2_2_ - uStack_4b0._2_2_) + (uStack_4c0._2_2_ - uStack_4d0._2_2_);
  sVar73 = (uStack_4a0._4_2_ - uStack_4b0._4_2_) + (uStack_4c0._4_2_ - uStack_4d0._4_2_);
  sVar79 = (uStack_4a0._6_2_ - uStack_4b0._6_2_) + (uStack_4c0._6_2_ - uStack_4d0._6_2_);
  uStack_3c0 = uStack_ab0;
  auVar9._8_8_ = uStack_ab0;
  auVar9._0_8_ = local_8d8;
  auVar8._8_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar8._0_8_ = 0x4e7b4e7b4e7b4e7b;
  auVar56 = pmulhw(auVar9,auVar8);
  uStack_3e0 = uStack_ad0;
  auVar7._8_8_ = uStack_ad0;
  auVar7._0_8_ = local_918;
  auVar6._8_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar6._0_8_ = 0x8a8c8a8c8a8c8a8c;
  auVar57 = pmulhw(auVar7,auVar6);
  uStack_600 = uStack_ab0;
  uStack_610 = uStack_ad0;
  local_b98 = auVar56._0_8_;
  uStack_b90 = auVar56._8_8_;
  local_ba8 = auVar57._0_8_;
  uStack_ba0 = auVar57._8_8_;
  local_628 = local_b98;
  uVar38 = local_628;
  uStack_620 = uStack_b90;
  uVar39 = uStack_620;
  local_638 = local_ba8;
  uVar34 = local_638;
  uStack_630 = uStack_ba0;
  uVar35 = uStack_630;
  local_628._0_2_ = auVar56._0_2_;
  local_628._2_2_ = auVar56._2_2_;
  local_628._4_2_ = auVar56._4_2_;
  local_628._6_2_ = auVar56._6_2_;
  uStack_620._0_2_ = auVar56._8_2_;
  uStack_620._2_2_ = auVar56._10_2_;
  uStack_620._4_2_ = auVar56._12_2_;
  uStack_620._6_2_ = auVar56._14_2_;
  local_638._0_2_ = auVar57._0_2_;
  local_638._2_2_ = auVar57._2_2_;
  local_638._4_2_ = auVar57._4_2_;
  local_638._6_2_ = auVar57._6_2_;
  uStack_630._0_2_ = auVar57._8_2_;
  uStack_630._2_2_ = auVar57._10_2_;
  uStack_630._4_2_ = auVar57._12_2_;
  uStack_630._6_2_ = auVar57._14_2_;
  local_648 = CONCAT26(local_4a8._6_2_ + local_4b8._6_2_,
                       CONCAT24(local_4a8._4_2_ + local_4b8._4_2_,
                                CONCAT22(local_4a8._2_2_ + local_4b8._2_2_,
                                         (short)local_4a8 + (short)local_4b8)));
  uStack_640 = CONCAT26(uStack_4a0._6_2_ + uStack_4b0._6_2_,
                        CONCAT24(uStack_4a0._4_2_ + uStack_4b0._4_2_,
                                 CONCAT22(uStack_4a0._2_2_ + uStack_4b0._2_2_,
                                          (short)uStack_4a0 + (short)uStack_4b0)));
  local_658 = CONCAT26(local_628._6_2_ + local_638._6_2_,
                       CONCAT24(local_628._4_2_ + local_638._4_2_,
                                CONCAT22(local_628._2_2_ + local_638._2_2_,
                                         (short)local_628 + (short)local_638)));
  uStack_650 = CONCAT26(uStack_620._6_2_ + uStack_630._6_2_,
                        CONCAT24(uStack_620._4_2_ + uStack_630._4_2_,
                                 CONCAT22(uStack_620._2_2_ + uStack_630._2_2_,
                                          (short)uStack_620 + (short)uStack_630)));
  sVar55 = (short)local_4a8 + (short)local_4b8 + (short)local_628 + (short)local_638;
  sVar60 = local_4a8._2_2_ + local_4b8._2_2_ + local_628._2_2_ + local_638._2_2_;
  sVar62 = local_4a8._4_2_ + local_4b8._4_2_ + local_628._4_2_ + local_638._4_2_;
  sVar64 = local_4a8._6_2_ + local_4b8._6_2_ + local_628._6_2_ + local_638._6_2_;
  sVar66 = (short)uStack_4a0 + (short)uStack_4b0 + (short)uStack_620 + (short)uStack_630;
  sVar68 = uStack_4a0._2_2_ + uStack_4b0._2_2_ + uStack_620._2_2_ + uStack_630._2_2_;
  sVar74 = uStack_4a0._4_2_ + uStack_4b0._4_2_ + uStack_620._4_2_ + uStack_630._4_2_;
  sVar80 = uStack_4a0._6_2_ + uStack_4b0._6_2_ + uStack_620._6_2_ + uStack_630._6_2_;
  local_668 = CONCAT26(local_5c8._6_2_ + local_5d8._6_2_,
                       CONCAT24(local_5c8._4_2_ + local_5d8._4_2_,
                                CONCAT22(local_5c8._2_2_ + local_5d8._2_2_,
                                         (short)local_5c8 + (short)local_5d8)));
  uStack_660 = CONCAT26(uStack_5c0._6_2_ + uStack_5d0._6_2_,
                        CONCAT24(uStack_5c0._4_2_ + uStack_5d0._4_2_,
                                 CONCAT22(uStack_5c0._2_2_ + uStack_5d0._2_2_,
                                          (short)uStack_5c0 + (short)uStack_5d0)));
  local_678 = CONCAT26(sVar64,CONCAT24(sVar62,CONCAT22(sVar60,sVar55)));
  uStack_670 = CONCAT26(sVar80,CONCAT24(sVar74,CONCAT22(sVar68,sVar66)));
  local_688 = CONCAT26(local_5c8._6_2_ - local_5d8._6_2_,
                       CONCAT24(local_5c8._4_2_ - local_5d8._4_2_,
                                CONCAT22(local_5c8._2_2_ - local_5d8._2_2_,
                                         (short)local_5c8 - (short)local_5d8)));
  uStack_680 = CONCAT26(uStack_5c0._6_2_ - uStack_5d0._6_2_,
                        CONCAT24(uStack_5c0._4_2_ - uStack_5d0._4_2_,
                                 CONCAT22(uStack_5c0._2_2_ - uStack_5d0._2_2_,
                                          (short)uStack_5c0 - (short)uStack_5d0)));
  local_698 = CONCAT26(sVar63,CONCAT24(sVar61,CONCAT22(sVar59,sVar54)));
  uStack_690 = CONCAT26(sVar79,CONCAT24(sVar73,CONCAT22(sVar67,sVar65)));
  local_4e8 = CONCAT26(local_5c8._6_2_ - local_5d8._6_2_,
                       CONCAT24(local_5c8._4_2_ - local_5d8._4_2_,
                                CONCAT22(local_5c8._2_2_ - local_5d8._2_2_,
                                         (short)local_5c8 - (short)local_5d8)));
  uStack_4e0 = CONCAT26(uStack_5c0._6_2_ - uStack_5d0._6_2_,
                        CONCAT24(uStack_5c0._4_2_ - uStack_5d0._4_2_,
                                 CONCAT22(uStack_5c0._2_2_ - uStack_5d0._2_2_,
                                          (short)uStack_5c0 - (short)uStack_5d0)));
  local_4f8 = CONCAT26(sVar63,CONCAT24(sVar61,CONCAT22(sVar59,sVar54)));
  uStack_4f0 = CONCAT26(sVar79,CONCAT24(sVar73,CONCAT22(sVar67,sVar65)));
  local_508 = CONCAT26(local_5c8._6_2_ + local_5d8._6_2_,
                       CONCAT24(local_5c8._4_2_ + local_5d8._4_2_,
                                CONCAT22(local_5c8._2_2_ + local_5d8._2_2_,
                                         (short)local_5c8 + (short)local_5d8)));
  uStack_500 = CONCAT26(uStack_5c0._6_2_ + uStack_5d0._6_2_,
                        CONCAT24(uStack_5c0._4_2_ + uStack_5d0._4_2_,
                                 CONCAT22(uStack_5c0._2_2_ + uStack_5d0._2_2_,
                                          (short)uStack_5c0 + (short)uStack_5d0)));
  local_518 = CONCAT26(sVar64,CONCAT24(sVar62,CONCAT22(sVar60,sVar55)));
  uStack_510 = CONCAT26(sVar80,CONCAT24(sVar74,CONCAT22(sVar68,sVar66)));
  in1_00 = (__m128i *)&local_a98;
  in0_00 = (__m128i *)&local_a88;
  local_a34 = in_EDX;
  local_a30 = in_RSI;
  local_638 = uVar34;
  uStack_630 = uVar35;
  local_628 = uVar38;
  uStack_620 = uVar39;
  local_618 = local_918;
  local_608 = local_8d8;
  local_5d8 = local_8f8;
  uStack_5d0 = uVar42;
  local_5c8 = local_8b8;
  uStack_5c0 = uVar43;
  local_4d8 = uVar44;
  uStack_4d0 = uVar45;
  local_4c8 = uVar46;
  uStack_4c0 = uVar47;
  local_4b8 = local_918;
  uStack_4b0 = uVar48;
  local_4a8 = local_8d8;
  uStack_4a0 = uVar49;
  local_498 = local_8f8;
  local_488 = local_8b8;
  local_3f8 = local_a58;
  uStack_3f0 = uStack_a50;
  local_3e8 = local_918;
  local_3d8 = local_a48;
  uStack_3d0 = uStack_a40;
  local_3c8 = local_8d8;
  local_3b8 = local_a48;
  uStack_3b0 = uStack_a40;
  local_3a8 = local_918;
  local_398 = local_a58;
  uStack_390 = uStack_a50;
  local_388 = local_8d8;
  local_68 = local_a48;
  uStack_60 = uStack_a40;
  local_48 = local_a58;
  uStack_40 = uStack_a50;
  VP8Transpose_2_4x4_16b
            (in0_00,in1_00,in_stack_fffffffffffff208,in1_00,in0_00,(__m128i *)0x120af5,
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff3b6,
                      CONCAT24(in_stack_fffffffffffff3b4,
                               CONCAT22(in_stack_fffffffffffff3b2,in_stack_fffffffffffff3b0))),
             (__m128i *)
             CONCAT26(in_stack_fffffffffffff3be,
                      CONCAT24(in_stack_fffffffffffff3bc,
                               CONCAT22(in_stack_fffffffffffff3ba,in_stack_fffffffffffff3b8))));
  local_a1e = 4;
  local_2 = 4;
  local_4 = 4;
  local_6 = 4;
  local_8 = 4;
  local_a = 4;
  local_c = 4;
  local_e = 4;
  local_10 = 4;
  local_6b8 = 0x4000400040004;
  uStack_6b0 = 0x4000400040004;
  local_6a8 = local_a68;
  uVar42 = local_6a8;
  uStack_6a0 = uStack_a60;
  uVar43 = uStack_6a0;
  local_6a8._0_2_ = (short)local_a68;
  local_6a8._2_2_ = (short)((ulong)local_a68 >> 0x10);
  local_6a8._4_2_ = (short)((ulong)local_a68 >> 0x20);
  local_6a8._6_2_ = (short)((ulong)local_a68 >> 0x30);
  uStack_6a0._0_2_ = (short)uStack_a60;
  uStack_6a0._2_2_ = (short)((ulong)uStack_a60 >> 0x10);
  uStack_6a0._4_2_ = (short)((ulong)uStack_a60 >> 0x20);
  uStack_6a0._6_2_ = (short)((ulong)uStack_a60 >> 0x30);
  local_6a8._0_2_ = (short)local_6a8 + 4;
  local_6a8._2_2_ = local_6a8._2_2_ + 4;
  local_6a8._4_2_ = local_6a8._4_2_ + 4;
  local_6a8._6_2_ = local_6a8._6_2_ + 4;
  uStack_6a0._0_2_ = (short)uStack_6a0 + 4;
  uStack_6a0._2_2_ = uStack_6a0._2_2_ + 4;
  uStack_6a0._4_2_ = uStack_6a0._4_2_ + 4;
  uStack_6a0._6_2_ = uStack_6a0._6_2_ + 4;
  local_6c8 = CONCAT26(local_6a8._6_2_,
                       CONCAT24(local_6a8._4_2_,CONCAT22(local_6a8._2_2_,(short)local_6a8)));
  uStack_6c0 = CONCAT26(uStack_6a0._6_2_,
                        CONCAT24(uStack_6a0._4_2_,CONCAT22(uStack_6a0._2_2_,(short)uStack_6a0)));
  local_6d8 = local_a88;
  lVar26 = local_6d8;
  uStack_6d0 = lStack_a80;
  lVar27 = uStack_6d0;
  local_6d8._0_2_ = (short)local_a88;
  local_6d8._2_2_ = (short)((ulong)local_a88 >> 0x10);
  local_6d8._4_2_ = (short)((ulong)local_a88 >> 0x20);
  local_6d8._6_2_ = (short)((ulong)local_a88 >> 0x30);
  uStack_6d0._0_2_ = (short)lStack_a80;
  uStack_6d0._2_2_ = (short)((ulong)lStack_a80 >> 0x10);
  uStack_6d0._4_2_ = (short)((ulong)lStack_a80 >> 0x20);
  uStack_6d0._6_2_ = (short)((ulong)lStack_a80 >> 0x30);
  sVar54 = (short)local_6a8 + (short)local_6d8;
  sVar60 = local_6a8._2_2_ + local_6d8._2_2_;
  sVar63 = local_6a8._4_2_ + local_6d8._4_2_;
  sVar66 = local_6a8._6_2_ + local_6d8._6_2_;
  sVar73 = (short)uStack_6a0 + (short)uStack_6d0;
  sVar69 = uStack_6a0._2_2_ + uStack_6d0._2_2_;
  sVar75 = uStack_6a0._4_2_ + uStack_6d0._4_2_;
  sVar81 = uStack_6a0._6_2_ + uStack_6d0._6_2_;
  local_528 = CONCAT26(local_6a8._6_2_,
                       CONCAT24(local_6a8._4_2_,CONCAT22(local_6a8._2_2_,(short)local_6a8)));
  uStack_520 = CONCAT26(uStack_6a0._6_2_,
                        CONCAT24(uStack_6a0._4_2_,CONCAT22(uStack_6a0._2_2_,(short)uStack_6a0)));
  local_538 = local_a88;
  lStack_530 = lStack_a80;
  local_6a8._0_2_ = (short)local_6a8 - (short)local_6d8;
  local_6a8._2_2_ = local_6a8._2_2_ - local_6d8._2_2_;
  local_6a8._4_2_ = local_6a8._4_2_ - local_6d8._4_2_;
  local_6a8._6_2_ = local_6a8._6_2_ - local_6d8._6_2_;
  sVar74 = (short)uStack_6a0 - (short)uStack_6d0;
  sVar70 = uStack_6a0._2_2_ - uStack_6d0._2_2_;
  sVar76 = uStack_6a0._4_2_ - uStack_6d0._4_2_;
  sVar82 = uStack_6a0._6_2_ - uStack_6d0._6_2_;
  local_408 = local_a78;
  uStack_400 = uStack_a70;
  local_418 = local_a58;
  uStack_410 = uStack_a50;
  auVar5._8_8_ = uStack_a70;
  auVar5._0_8_ = local_a78;
  auVar4._8_8_ = uStack_a50;
  auVar4._0_8_ = local_a58;
  auVar56 = pmulhw(auVar5,auVar4);
  local_428 = local_a98;
  lStack_420 = lStack_a90;
  local_438 = local_a48;
  uStack_430 = uStack_a40;
  auVar3._8_8_ = lStack_a90;
  auVar3._0_8_ = local_a98;
  auVar2._8_8_ = uStack_a40;
  auVar2._0_8_ = local_a48;
  auVar57 = pmulhw(auVar3,auVar2);
  local_548 = local_a78;
  uVar48 = local_548;
  uStack_540 = uStack_a70;
  uVar49 = uStack_540;
  local_558 = local_a98;
  lVar30 = local_558;
  uStack_550 = lStack_a90;
  lVar31 = uStack_550;
  local_548._0_2_ = (short)local_a78;
  local_548._2_2_ = (short)((ulong)local_a78 >> 0x10);
  local_548._4_2_ = (short)((ulong)local_a78 >> 0x20);
  local_548._6_2_ = (short)((ulong)local_a78 >> 0x30);
  uStack_540._0_2_ = (short)uStack_a70;
  uStack_540._2_2_ = (short)((ulong)uStack_a70 >> 0x10);
  uStack_540._4_2_ = (short)((ulong)uStack_a70 >> 0x20);
  uStack_540._6_2_ = (short)((ulong)uStack_a70 >> 0x30);
  local_558._0_2_ = (short)local_a98;
  local_558._2_2_ = (short)((ulong)local_a98 >> 0x10);
  local_558._4_2_ = (short)((ulong)local_a98 >> 0x20);
  local_558._6_2_ = (short)((ulong)local_a98 >> 0x30);
  uStack_550._0_2_ = (short)lStack_a90;
  uStack_550._2_2_ = (short)((ulong)lStack_a90 >> 0x10);
  uStack_550._4_2_ = (short)((ulong)lStack_a90 >> 0x20);
  uStack_550._6_2_ = (short)((ulong)lStack_a90 >> 0x30);
  local_c68 = auVar56._0_8_;
  uStack_c60 = auVar56._8_8_;
  local_c78 = auVar57._0_8_;
  uStack_c70 = auVar57._8_8_;
  local_568 = local_c68;
  uVar46 = local_568;
  uStack_560 = uStack_c60;
  uVar47 = uStack_560;
  local_578 = local_c78;
  uVar44 = local_578;
  uStack_570 = uStack_c70;
  uVar45 = uStack_570;
  local_568._0_2_ = auVar56._0_2_;
  local_568._2_2_ = auVar56._2_2_;
  local_568._4_2_ = auVar56._4_2_;
  local_568._6_2_ = auVar56._6_2_;
  uStack_560._0_2_ = auVar56._8_2_;
  uStack_560._2_2_ = auVar56._10_2_;
  uStack_560._4_2_ = auVar56._12_2_;
  uStack_560._6_2_ = auVar56._14_2_;
  local_578._0_2_ = auVar57._0_2_;
  local_578._2_2_ = auVar57._2_2_;
  local_578._4_2_ = auVar57._4_2_;
  local_578._6_2_ = auVar57._6_2_;
  uStack_570._0_2_ = auVar57._8_2_;
  uStack_570._2_2_ = auVar57._10_2_;
  uStack_570._4_2_ = auVar57._12_2_;
  uStack_570._6_2_ = auVar57._14_2_;
  local_6e8 = CONCAT26(local_548._6_2_ - local_558._6_2_,
                       CONCAT24(local_548._4_2_ - local_558._4_2_,
                                CONCAT22(local_548._2_2_ - local_558._2_2_,
                                         (short)local_548 - (short)local_558)));
  uStack_6e0 = CONCAT26(uStack_540._6_2_ - uStack_550._6_2_,
                        CONCAT24(uStack_540._4_2_ - uStack_550._4_2_,
                                 CONCAT22(uStack_540._2_2_ - uStack_550._2_2_,
                                          (short)uStack_540 - (short)uStack_550)));
  local_6f8 = CONCAT26(local_568._6_2_ - local_578._6_2_,
                       CONCAT24(local_568._4_2_ - local_578._4_2_,
                                CONCAT22(local_568._2_2_ - local_578._2_2_,
                                         (short)local_568 - (short)local_578)));
  uStack_6f0 = CONCAT26(uStack_560._6_2_ - uStack_570._6_2_,
                        CONCAT24(uStack_560._4_2_ - uStack_570._4_2_,
                                 CONCAT22(uStack_560._2_2_ - uStack_570._2_2_,
                                          (short)uStack_560 - (short)uStack_570)));
  sVar55 = ((short)local_548 - (short)local_558) + ((short)local_568 - (short)local_578);
  sVar61 = (local_548._2_2_ - local_558._2_2_) + (local_568._2_2_ - local_578._2_2_);
  sVar64 = (local_548._4_2_ - local_558._4_2_) + (local_568._4_2_ - local_578._4_2_);
  sVar67 = (local_548._6_2_ - local_558._6_2_) + (local_568._6_2_ - local_578._6_2_);
  sVar79 = ((short)uStack_540 - (short)uStack_550) + ((short)uStack_560 - (short)uStack_570);
  sVar71 = (uStack_540._2_2_ - uStack_550._2_2_) + (uStack_560._2_2_ - uStack_570._2_2_);
  sVar77 = (uStack_540._4_2_ - uStack_550._4_2_) + (uStack_560._4_2_ - uStack_570._4_2_);
  sVar83 = (uStack_540._6_2_ - uStack_550._6_2_) + (uStack_560._6_2_ - uStack_570._6_2_);
  local_448 = local_a78;
  uStack_440 = uStack_a70;
  local_458 = local_a48;
  uStack_450 = uStack_a40;
  auVar1._8_8_ = uStack_a70;
  auVar1._0_8_ = local_a78;
  auVar58._8_8_ = uStack_a40;
  auVar58._0_8_ = local_a48;
  auVar58 = pmulhw(auVar1,auVar58);
  local_468 = local_a98;
  lStack_460 = lStack_a90;
  local_478 = local_a58;
  uStack_470 = uStack_a50;
  auVar57._8_8_ = lStack_a90;
  auVar57._0_8_ = local_a98;
  auVar56._8_8_ = uStack_a50;
  auVar56._0_8_ = local_a58;
  auVar56 = pmulhw(auVar57,auVar56);
  local_708 = local_a78;
  uStack_700 = uStack_a70;
  local_718 = local_a98;
  lStack_710 = lStack_a90;
  local_cb8 = auVar58._0_8_;
  uStack_cb0 = auVar58._8_8_;
  local_cc8 = auVar56._0_8_;
  uStack_cc0 = auVar56._8_8_;
  local_728 = local_cb8;
  uVar38 = local_728;
  uStack_720 = uStack_cb0;
  uVar39 = uStack_720;
  local_738 = local_cc8;
  uVar34 = local_738;
  uStack_730 = uStack_cc0;
  uVar35 = uStack_730;
  local_728._0_2_ = auVar58._0_2_;
  local_728._2_2_ = auVar58._2_2_;
  local_728._4_2_ = auVar58._4_2_;
  local_728._6_2_ = auVar58._6_2_;
  uStack_720._0_2_ = auVar58._8_2_;
  uStack_720._2_2_ = auVar58._10_2_;
  uStack_720._4_2_ = auVar58._12_2_;
  uStack_720._6_2_ = auVar58._14_2_;
  local_738._0_2_ = auVar56._0_2_;
  local_738._2_2_ = auVar56._2_2_;
  local_738._4_2_ = auVar56._4_2_;
  local_738._6_2_ = auVar56._6_2_;
  uStack_730._0_2_ = auVar56._8_2_;
  uStack_730._2_2_ = auVar56._10_2_;
  uStack_730._4_2_ = auVar56._12_2_;
  uStack_730._6_2_ = auVar56._14_2_;
  local_748 = CONCAT26(local_548._6_2_ + local_558._6_2_,
                       CONCAT24(local_548._4_2_ + local_558._4_2_,
                                CONCAT22(local_548._2_2_ + local_558._2_2_,
                                         (short)local_548 + (short)local_558)));
  uStack_740 = CONCAT26(uStack_540._6_2_ + uStack_550._6_2_,
                        CONCAT24(uStack_540._4_2_ + uStack_550._4_2_,
                                 CONCAT22(uStack_540._2_2_ + uStack_550._2_2_,
                                          (short)uStack_540 + (short)uStack_550)));
  local_758 = CONCAT26(local_728._6_2_ + local_738._6_2_,
                       CONCAT24(local_728._4_2_ + local_738._4_2_,
                                CONCAT22(local_728._2_2_ + local_738._2_2_,
                                         (short)local_728 + (short)local_738)));
  uStack_750 = CONCAT26(uStack_720._6_2_ + uStack_730._6_2_,
                        CONCAT24(uStack_720._4_2_ + uStack_730._4_2_,
                                 CONCAT22(uStack_720._2_2_ + uStack_730._2_2_,
                                          (short)uStack_720 + (short)uStack_730)));
  sVar59 = (short)local_548 + (short)local_558 + (short)local_728 + (short)local_738;
  sVar62 = local_548._2_2_ + local_558._2_2_ + local_728._2_2_ + local_738._2_2_;
  sVar65 = local_548._4_2_ + local_558._4_2_ + local_728._4_2_ + local_738._4_2_;
  sVar68 = local_548._6_2_ + local_558._6_2_ + local_728._6_2_ + local_738._6_2_;
  sVar80 = (short)uStack_540 + (short)uStack_550 + (short)uStack_720 + (short)uStack_730;
  sVar72 = uStack_540._2_2_ + uStack_550._2_2_ + uStack_720._2_2_ + uStack_730._2_2_;
  sVar78 = uStack_540._4_2_ + uStack_550._4_2_ + uStack_720._4_2_ + uStack_730._4_2_;
  sVar84 = uStack_540._6_2_ + uStack_550._6_2_ + uStack_720._6_2_ + uStack_730._6_2_;
  local_768 = CONCAT26(sVar66,CONCAT24(sVar63,CONCAT22(sVar60,sVar54)));
  uStack_760 = CONCAT26(sVar81,CONCAT24(sVar75,CONCAT22(sVar69,sVar73)));
  local_778 = CONCAT26(sVar68,CONCAT24(sVar65,CONCAT22(sVar62,sVar59)));
  uStack_770 = CONCAT26(sVar84,CONCAT24(sVar78,CONCAT22(sVar72,sVar80)));
  local_788 = CONCAT26(local_6a8._6_2_,
                       CONCAT24(local_6a8._4_2_,CONCAT22(local_6a8._2_2_,(short)local_6a8)));
  uStack_780 = CONCAT26(sVar82,CONCAT24(sVar76,CONCAT22(sVar70,sVar74)));
  local_798 = CONCAT26(sVar67,CONCAT24(sVar64,CONCAT22(sVar61,sVar55)));
  uStack_790 = CONCAT26(sVar83,CONCAT24(sVar77,CONCAT22(sVar71,sVar79)));
  local_588 = CONCAT26(local_6a8._6_2_,
                       CONCAT24(local_6a8._4_2_,CONCAT22(local_6a8._2_2_,(short)local_6a8)));
  uStack_580 = CONCAT26(sVar82,CONCAT24(sVar76,CONCAT22(sVar70,sVar74)));
  local_598 = CONCAT26(sVar67,CONCAT24(sVar64,CONCAT22(sVar61,sVar55)));
  uStack_590 = CONCAT26(sVar83,CONCAT24(sVar77,CONCAT22(sVar71,sVar79)));
  local_5a8 = CONCAT26(sVar66,CONCAT24(sVar63,CONCAT22(sVar60,sVar54)));
  uStack_5a0 = CONCAT26(sVar81,CONCAT24(sVar75,CONCAT22(sVar69,sVar73)));
  local_5b8 = CONCAT26(sVar68,CONCAT24(sVar65,CONCAT22(sVar62,sVar59)));
  uStack_5b0 = CONCAT26(sVar84,CONCAT24(sVar78,CONCAT22(sVar72,sVar80)));
  local_308 = CONCAT26(sVar66 + sVar68,
                       CONCAT24(sVar63 + sVar65,CONCAT22(sVar60 + sVar62,sVar54 + sVar59)));
  uStack_300 = CONCAT26(sVar81 + sVar84,
                        CONCAT24(sVar75 + sVar78,CONCAT22(sVar69 + sVar72,sVar73 + sVar80)));
  local_30c = 3;
  auVar17._8_8_ = uStack_300;
  auVar17._0_8_ = local_308;
  psraw(auVar17,ZEXT416(3));
  local_328 = CONCAT26(local_6a8._6_2_ + sVar67,
                       CONCAT24(local_6a8._4_2_ + sVar64,
                                CONCAT22(local_6a8._2_2_ + sVar61,(short)local_6a8 + sVar55)));
  uStack_320 = CONCAT26(sVar82 + sVar83,
                        CONCAT24(sVar76 + sVar77,CONCAT22(sVar70 + sVar71,sVar74 + sVar79)));
  local_32c = 3;
  auVar16._8_8_ = uStack_320;
  auVar16._0_8_ = local_328;
  psraw(auVar16,ZEXT416(3));
  local_348 = CONCAT26(local_6a8._6_2_ - sVar67,
                       CONCAT24(local_6a8._4_2_ - sVar64,
                                CONCAT22(local_6a8._2_2_ - sVar61,(short)local_6a8 - sVar55)));
  uStack_340 = CONCAT26(sVar82 - sVar83,
                        CONCAT24(sVar76 - sVar77,CONCAT22(sVar70 - sVar71,sVar74 - sVar79)));
  local_34c = 3;
  auVar15._8_8_ = uStack_340;
  auVar15._0_8_ = local_348;
  psraw(auVar15,ZEXT416(3));
  local_368 = CONCAT26(sVar66 - sVar68,
                       CONCAT24(sVar63 - sVar65,CONCAT22(sVar60 - sVar62,sVar54 - sVar59)));
  uStack_360 = CONCAT26(sVar81 - sVar84,
                        CONCAT24(sVar75 - sVar78,CONCAT22(sVar69 - sVar72,sVar73 - sVar80)));
  local_36c = 3;
  auVar14._8_8_ = uStack_360;
  auVar14._0_8_ = local_368;
  psraw(auVar14,ZEXT416(3));
  local_738 = uVar34;
  uStack_730 = uVar35;
  local_728 = uVar38;
  uStack_720 = uVar39;
  local_6d8 = lVar26;
  uStack_6d0 = lVar27;
  local_6a8 = uVar42;
  uStack_6a0 = uVar43;
  local_578 = uVar44;
  uStack_570 = uVar45;
  local_568 = uVar46;
  uStack_560 = uVar47;
  local_558 = lVar30;
  uStack_550 = lVar31;
  local_548 = uVar48;
  uStack_540 = uVar49;
  local_28 = local_6b8;
  uStack_20 = uStack_6b0;
  VP8Transpose_2_4x4_16b
            (in0_00,in1_00,in_stack_fffffffffffff208,in1_00,in0_00,(__m128i *)0x1210ff,
             (__m128i *)CONCAT26(sVar82,CONCAT24(sVar76,CONCAT22(sVar70,sVar74))),
             (__m128i *)CONCAT26(sVar66,CONCAT24(sVar63,CONCAT22(sVar60,sVar54))));
  local_2f8 = 0;
  uStack_2f0 = 0;
  if (local_a34 == 0) {
    local_26c = WebPMemToUint32((uint8_t *)local_a30);
    local_288._4_4_ = 0;
    local_288._0_4_ = local_26c;
    local_d98 = local_288._0_8_;
    local_288 = ZEXT416(local_26c);
    local_28c = WebPMemToUint32((uint8_t *)(local_a30 + 4));
    local_2a8._4_4_ = 0;
    local_2a8._0_4_ = local_28c;
    local_da8 = local_2a8._0_8_;
    local_2a8 = ZEXT416(local_28c);
    local_2ac = WebPMemToUint32((uint8_t *)(local_a30 + 8));
    local_2c8._4_4_ = 0;
    local_2c8._0_4_ = local_2ac;
    local_db8 = local_2c8._0_8_;
    local_2c8 = ZEXT416(local_2ac);
    local_2cc = WebPMemToUint32((uint8_t *)(local_a30 + 0xc));
    local_2e8._4_4_ = 0;
    local_2e8._0_4_ = local_2cc;
    local_dc8 = local_2e8._0_8_;
    local_2e8 = ZEXT416(local_2cc);
  }
  else {
    local_9a0 = local_a30;
    local_d98 = *local_a30;
    uStack_9b0 = 0;
    local_9c0 = local_a30 + 4;
    local_da8 = *local_9c0;
    uStack_9d0 = 0;
    local_9e0 = local_a30 + 8;
    local_db8 = *local_9e0;
    uStack_9f0 = 0;
    local_a00 = local_a30 + 0xc;
    local_dc8 = *local_a00;
    uStack_a10 = 0;
    local_a18 = local_dc8;
    local_9f8 = local_db8;
    local_9d8 = local_da8;
    local_9b8 = local_d98;
  }
  local_1f8 = local_d98;
  uVar53 = local_1f8;
  uStack_1f0 = 0;
  local_208 = 0;
  uStack_200 = 0;
  local_1f8._1_1_ = (byte)(local_d98 >> 8);
  local_1f8._2_1_ = (byte)(local_d98 >> 0x10);
  local_1f8._3_1_ = (byte)(local_d98 >> 0x18);
  local_1f8._4_1_ = (byte)(local_d98 >> 0x20);
  local_1f8._5_1_ = (byte)(local_d98 >> 0x28);
  local_1f8._6_1_ = (byte)(local_d98 >> 0x30);
  local_1f8._7_1_ = (byte)(local_d98 >> 0x38);
  local_d98._0_2_ = (ushort)(byte)local_d98;
  uVar24 = (ushort)local_d98;
  local_d98._0_3_ = CONCAT12(local_1f8._1_1_,(ushort)local_d98);
  local_d98._0_4_ = (uint)(uint3)local_d98;
  local_d98._0_5_ = CONCAT14(local_1f8._2_1_,(uint)local_d98);
  local_d98._0_6_ = (uint6)(uint5)local_d98;
  local_d98._0_7_ = CONCAT16(local_1f8._3_1_,(uint6)local_d98);
  local_d98 = (ulong)(uint7)local_d98;
  uStack_d90._0_2_ = (ushort)local_1f8._4_1_;
  uVar25 = (ushort)uStack_d90;
  uStack_d90._0_3_ = CONCAT12(local_1f8._5_1_,(ushort)uStack_d90);
  uStack_d90._0_4_ = (uint)(uint3)uStack_d90;
  uStack_d90._0_5_ = CONCAT14(local_1f8._6_1_,(uint)uStack_d90);
  uStack_d90._0_6_ = (uint6)(uint5)uStack_d90;
  uStack_d90._0_7_ = CONCAT16(local_1f8._7_1_,(uint6)uStack_d90);
  uStack_d90 = (ulong)(uint7)uStack_d90;
  local_218 = local_da8;
  uVar52 = local_218;
  uStack_210 = 0;
  local_228 = 0;
  uStack_220 = 0;
  local_218._1_1_ = (byte)(local_da8 >> 8);
  local_218._2_1_ = (byte)(local_da8 >> 0x10);
  local_218._3_1_ = (byte)(local_da8 >> 0x18);
  local_218._4_1_ = (byte)(local_da8 >> 0x20);
  local_218._5_1_ = (byte)(local_da8 >> 0x28);
  local_218._6_1_ = (byte)(local_da8 >> 0x30);
  local_218._7_1_ = (byte)(local_da8 >> 0x38);
  local_da8._0_2_ = (ushort)(byte)local_da8;
  uVar22 = (ushort)local_da8;
  local_da8._0_3_ = CONCAT12(local_218._1_1_,(ushort)local_da8);
  local_da8._0_4_ = (uint)(uint3)local_da8;
  local_da8._0_5_ = CONCAT14(local_218._2_1_,(uint)local_da8);
  local_da8._0_6_ = (uint6)(uint5)local_da8;
  local_da8._0_7_ = CONCAT16(local_218._3_1_,(uint6)local_da8);
  local_da8 = (ulong)(uint7)local_da8;
  uStack_da0._0_2_ = (ushort)local_218._4_1_;
  uVar23 = (ushort)uStack_da0;
  uStack_da0._0_3_ = CONCAT12(local_218._5_1_,(ushort)uStack_da0);
  uStack_da0._0_4_ = (uint)(uint3)uStack_da0;
  uStack_da0._0_5_ = CONCAT14(local_218._6_1_,(uint)uStack_da0);
  uStack_da0._0_6_ = (uint6)(uint5)uStack_da0;
  uStack_da0._0_7_ = CONCAT16(local_218._7_1_,(uint6)uStack_da0);
  uStack_da0 = (ulong)(uint7)uStack_da0;
  local_238 = local_db8;
  uVar51 = local_238;
  uStack_230 = 0;
  local_248 = 0;
  uStack_240 = 0;
  local_238._1_1_ = (byte)(local_db8 >> 8);
  local_238._2_1_ = (byte)(local_db8 >> 0x10);
  local_238._3_1_ = (byte)(local_db8 >> 0x18);
  local_238._4_1_ = (byte)(local_db8 >> 0x20);
  local_238._5_1_ = (byte)(local_db8 >> 0x28);
  local_238._6_1_ = (byte)(local_db8 >> 0x30);
  local_238._7_1_ = (byte)(local_db8 >> 0x38);
  local_db8._0_2_ = (ushort)(byte)local_db8;
  uVar20 = (ushort)local_db8;
  local_db8._0_3_ = CONCAT12(local_238._1_1_,(ushort)local_db8);
  local_db8._0_4_ = (uint)(uint3)local_db8;
  local_db8._0_5_ = CONCAT14(local_238._2_1_,(uint)local_db8);
  local_db8._0_6_ = (uint6)(uint5)local_db8;
  local_db8._0_7_ = CONCAT16(local_238._3_1_,(uint6)local_db8);
  local_db8 = (ulong)(uint7)local_db8;
  uStack_db0._0_2_ = (ushort)local_238._4_1_;
  uVar21 = (ushort)uStack_db0;
  uStack_db0._0_3_ = CONCAT12(local_238._5_1_,(ushort)uStack_db0);
  uStack_db0._0_4_ = (uint)(uint3)uStack_db0;
  uStack_db0._0_5_ = CONCAT14(local_238._6_1_,(uint)uStack_db0);
  uStack_db0._0_6_ = (uint6)(uint5)uStack_db0;
  uStack_db0._0_7_ = CONCAT16(local_238._7_1_,(uint6)uStack_db0);
  uStack_db0 = (ulong)(uint7)uStack_db0;
  local_258 = local_dc8;
  uVar50 = local_258;
  uStack_250 = 0;
  local_268 = 0;
  uStack_260 = 0;
  local_258._1_1_ = (byte)(local_dc8 >> 8);
  local_258._2_1_ = (byte)(local_dc8 >> 0x10);
  local_258._3_1_ = (byte)(local_dc8 >> 0x18);
  local_258._4_1_ = (byte)(local_dc8 >> 0x20);
  local_258._5_1_ = (byte)(local_dc8 >> 0x28);
  local_258._6_1_ = (byte)(local_dc8 >> 0x30);
  local_258._7_1_ = (byte)(local_dc8 >> 0x38);
  local_dc8._0_2_ = (ushort)(byte)local_dc8;
  uVar18 = (ushort)local_dc8;
  local_dc8._0_3_ = CONCAT12(local_258._1_1_,(ushort)local_dc8);
  local_dc8._0_4_ = (uint)(uint3)local_dc8;
  local_dc8._0_5_ = CONCAT14(local_258._2_1_,(uint)local_dc8);
  local_dc8._0_6_ = (uint6)(uint5)local_dc8;
  local_dc8._0_7_ = CONCAT16(local_258._3_1_,(uint6)local_dc8);
  local_dc8 = (ulong)(uint7)local_dc8;
  uStack_dc0._0_2_ = (ushort)local_258._4_1_;
  uVar19 = (ushort)uStack_dc0;
  uStack_dc0._0_3_ = CONCAT12(local_258._5_1_,(ushort)uStack_dc0);
  uStack_dc0._0_4_ = (uint)(uint3)uStack_dc0;
  uStack_dc0._0_5_ = CONCAT14(local_258._6_1_,(uint)uStack_dc0);
  uStack_dc0._0_6_ = (uint6)(uint5)uStack_dc0;
  uStack_dc0._0_7_ = CONCAT16(local_258._7_1_,(uint6)uStack_dc0);
  uStack_dc0 = (ulong)(uint7)uStack_dc0;
  local_7a8 = local_d98;
  uVar40 = local_7a8;
  uStack_7a0 = uStack_d90;
  uVar41 = uStack_7a0;
  local_7b8 = local_a68;
  uVar38 = local_7b8;
  uStack_7b0 = uStack_a60;
  uVar39 = uStack_7b0;
  local_7a8._2_2_ = (ushort)local_1f8._1_1_;
  local_7a8._4_2_ = (ushort)local_1f8._2_1_;
  local_7a8._6_2_ = (ushort)local_1f8._3_1_;
  uStack_7a0._2_2_ = (ushort)local_1f8._5_1_;
  uStack_7a0._4_2_ = (ushort)local_1f8._6_1_;
  uStack_7a0._6_2_ = (ushort)local_1f8._7_1_;
  local_7b8._0_2_ = (short)local_a68;
  local_7b8._2_2_ = (short)((ulong)local_a68 >> 0x10);
  local_7b8._4_2_ = (short)((ulong)local_a68 >> 0x20);
  local_7b8._6_2_ = (short)((ulong)local_a68 >> 0x30);
  uStack_7b0._0_2_ = (short)uStack_a60;
  uStack_7b0._2_2_ = (short)((ulong)uStack_a60 >> 0x10);
  uStack_7b0._4_2_ = (short)((ulong)uStack_a60 >> 0x20);
  uStack_7b0._6_2_ = (short)((ulong)uStack_a60 >> 0x30);
  local_7b8._0_2_ = uVar24 + (short)local_7b8;
  local_7b8._2_2_ = local_7a8._2_2_ + local_7b8._2_2_;
  local_7b8._4_2_ = local_7a8._4_2_ + local_7b8._4_2_;
  local_7b8._6_2_ = local_7a8._6_2_ + local_7b8._6_2_;
  uStack_7b0._0_2_ = uVar25 + (short)uStack_7b0;
  uStack_7b0._2_2_ = uStack_7a0._2_2_ + uStack_7b0._2_2_;
  uStack_7b0._4_2_ = uStack_7a0._4_2_ + uStack_7b0._4_2_;
  uStack_7b0._6_2_ = uStack_7a0._6_2_ + uStack_7b0._6_2_;
  local_d98._0_4_ = CONCAT22(local_7b8._2_2_,(short)local_7b8);
  local_d98._0_6_ = CONCAT24(local_7b8._4_2_,(uint)local_d98);
  local_d98 = CONCAT26(local_7b8._6_2_,(uint6)local_d98);
  uStack_d90._0_4_ = CONCAT22(uStack_7b0._2_2_,(short)uStack_7b0);
  uStack_d90._0_6_ = CONCAT24(uStack_7b0._4_2_,(uint)uStack_d90);
  uStack_d90 = CONCAT26(uStack_7b0._6_2_,(uint6)uStack_d90);
  local_7c8 = local_da8;
  uVar36 = local_7c8;
  uStack_7c0 = uStack_da0;
  uVar37 = uStack_7c0;
  local_7d8 = local_a78;
  uVar34 = local_7d8;
  uStack_7d0 = uStack_a70;
  uVar35 = uStack_7d0;
  local_7c8._2_2_ = (ushort)local_218._1_1_;
  local_7c8._4_2_ = (ushort)local_218._2_1_;
  local_7c8._6_2_ = (ushort)local_218._3_1_;
  uStack_7c0._2_2_ = (ushort)local_218._5_1_;
  uStack_7c0._4_2_ = (ushort)local_218._6_1_;
  uStack_7c0._6_2_ = (ushort)local_218._7_1_;
  local_7d8._0_2_ = (short)local_a78;
  local_7d8._2_2_ = (short)((ulong)local_a78 >> 0x10);
  local_7d8._4_2_ = (short)((ulong)local_a78 >> 0x20);
  local_7d8._6_2_ = (short)((ulong)local_a78 >> 0x30);
  uStack_7d0._0_2_ = (short)uStack_a70;
  uStack_7d0._2_2_ = (short)((ulong)uStack_a70 >> 0x10);
  uStack_7d0._4_2_ = (short)((ulong)uStack_a70 >> 0x20);
  uStack_7d0._6_2_ = (short)((ulong)uStack_a70 >> 0x30);
  local_7d8._0_2_ = uVar22 + (short)local_7d8;
  local_7d8._2_2_ = local_7c8._2_2_ + local_7d8._2_2_;
  local_7d8._4_2_ = local_7c8._4_2_ + local_7d8._4_2_;
  local_7d8._6_2_ = local_7c8._6_2_ + local_7d8._6_2_;
  uStack_7d0._0_2_ = uVar23 + (short)uStack_7d0;
  uStack_7d0._2_2_ = uStack_7c0._2_2_ + uStack_7d0._2_2_;
  uStack_7d0._4_2_ = uStack_7c0._4_2_ + uStack_7d0._4_2_;
  uStack_7d0._6_2_ = uStack_7c0._6_2_ + uStack_7d0._6_2_;
  local_da8._0_4_ = CONCAT22(local_7d8._2_2_,(short)local_7d8);
  local_da8._0_6_ = CONCAT24(local_7d8._4_2_,(uint)local_da8);
  local_da8 = CONCAT26(local_7d8._6_2_,(uint6)local_da8);
  uStack_da0._0_4_ = CONCAT22(uStack_7d0._2_2_,(short)uStack_7d0);
  uStack_da0._0_6_ = CONCAT24(uStack_7d0._4_2_,(uint)uStack_da0);
  uStack_da0 = CONCAT26(uStack_7d0._6_2_,(uint6)uStack_da0);
  local_7e8 = local_db8;
  uVar32 = local_7e8;
  uStack_7e0 = uStack_db0;
  uVar33 = uStack_7e0;
  local_7f8 = local_a88;
  lVar30 = local_7f8;
  uStack_7f0 = lStack_a80;
  lVar31 = uStack_7f0;
  local_7e8._2_2_ = (ushort)local_238._1_1_;
  local_7e8._4_2_ = (ushort)local_238._2_1_;
  local_7e8._6_2_ = (ushort)local_238._3_1_;
  uStack_7e0._2_2_ = (ushort)local_238._5_1_;
  uStack_7e0._4_2_ = (ushort)local_238._6_1_;
  uStack_7e0._6_2_ = (ushort)local_238._7_1_;
  local_7f8._0_2_ = (short)local_a88;
  local_7f8._2_2_ = (short)((ulong)local_a88 >> 0x10);
  local_7f8._4_2_ = (short)((ulong)local_a88 >> 0x20);
  local_7f8._6_2_ = (short)((ulong)local_a88 >> 0x30);
  uStack_7f0._0_2_ = (short)lStack_a80;
  uStack_7f0._2_2_ = (short)((ulong)lStack_a80 >> 0x10);
  uStack_7f0._4_2_ = (short)((ulong)lStack_a80 >> 0x20);
  uStack_7f0._6_2_ = (short)((ulong)lStack_a80 >> 0x30);
  local_7f8._0_2_ = uVar20 + (short)local_7f8;
  local_7f8._2_2_ = local_7e8._2_2_ + local_7f8._2_2_;
  local_7f8._4_2_ = local_7e8._4_2_ + local_7f8._4_2_;
  local_7f8._6_2_ = local_7e8._6_2_ + local_7f8._6_2_;
  uStack_7f0._0_2_ = uVar21 + (short)uStack_7f0;
  uStack_7f0._2_2_ = uStack_7e0._2_2_ + uStack_7f0._2_2_;
  uStack_7f0._4_2_ = uStack_7e0._4_2_ + uStack_7f0._4_2_;
  uStack_7f0._6_2_ = uStack_7e0._6_2_ + uStack_7f0._6_2_;
  local_db8._0_4_ = CONCAT22(local_7f8._2_2_,(short)local_7f8);
  local_db8._0_6_ = CONCAT24(local_7f8._4_2_,(uint)local_db8);
  local_db8 = CONCAT26(local_7f8._6_2_,(uint6)local_db8);
  uStack_db0._0_4_ = CONCAT22(uStack_7f0._2_2_,(short)uStack_7f0);
  uStack_db0._0_6_ = CONCAT24(uStack_7f0._4_2_,(uint)uStack_db0);
  uStack_db0 = CONCAT26(uStack_7f0._6_2_,(uint6)uStack_db0);
  local_808 = local_dc8;
  uVar28 = local_808;
  uStack_800 = uStack_dc0;
  uVar29 = uStack_800;
  local_818 = local_a98;
  lVar26 = local_818;
  uStack_810 = lStack_a90;
  lVar27 = uStack_810;
  local_808._2_2_ = (ushort)local_258._1_1_;
  local_808._4_2_ = (ushort)local_258._2_1_;
  local_808._6_2_ = (ushort)local_258._3_1_;
  uStack_800._2_2_ = (ushort)local_258._5_1_;
  uStack_800._4_2_ = (ushort)local_258._6_1_;
  uStack_800._6_2_ = (ushort)local_258._7_1_;
  local_818._0_2_ = (short)local_a98;
  local_818._2_2_ = (short)((ulong)local_a98 >> 0x10);
  local_818._4_2_ = (short)((ulong)local_a98 >> 0x20);
  local_818._6_2_ = (short)((ulong)local_a98 >> 0x30);
  uStack_810._0_2_ = (short)lStack_a90;
  uStack_810._2_2_ = (short)((ulong)lStack_a90 >> 0x10);
  uStack_810._4_2_ = (short)((ulong)lStack_a90 >> 0x20);
  uStack_810._6_2_ = (short)((ulong)lStack_a90 >> 0x30);
  local_818._0_2_ = uVar18 + (short)local_818;
  local_818._2_2_ = local_808._2_2_ + local_818._2_2_;
  local_818._4_2_ = local_808._4_2_ + local_818._4_2_;
  local_818._6_2_ = local_808._6_2_ + local_818._6_2_;
  uStack_810._0_2_ = uVar19 + (short)uStack_810;
  uStack_810._2_2_ = uStack_800._2_2_ + uStack_810._2_2_;
  uStack_810._4_2_ = uStack_800._4_2_ + uStack_810._4_2_;
  uStack_810._6_2_ = uStack_800._6_2_ + uStack_810._6_2_;
  local_dc8._0_4_ = CONCAT22(local_818._2_2_,(short)local_818);
  local_dc8._0_6_ = CONCAT24(local_818._4_2_,(uint)local_dc8);
  local_dc8 = CONCAT26(local_818._6_2_,(uint6)local_dc8);
  uStack_dc0._0_4_ = CONCAT22(uStack_810._2_2_,(short)uStack_810);
  uStack_dc0._0_6_ = CONCAT24(uStack_810._4_2_,(uint)uStack_dc0);
  uStack_dc0 = CONCAT26(uStack_810._6_2_,(uint6)uStack_dc0);
  local_178 = local_d98;
  uStack_170 = uStack_d90;
  local_188 = local_d98;
  uStack_180 = uStack_d90;
  local_d98._0_2_ =
       CONCAT11((0 < local_7b8._2_2_) * (local_7b8._2_2_ < 0x100) * (char)local_7b8._2_2_ -
                (0xff < local_7b8._2_2_),
                (0 < (short)local_7b8) * ((short)local_7b8 < 0x100) * (char)(short)local_7b8 -
                (0xff < (short)local_7b8));
  local_d98._0_3_ =
       CONCAT12((0 < local_7b8._4_2_) * (local_7b8._4_2_ < 0x100) * (char)local_7b8._4_2_ -
                (0xff < local_7b8._4_2_),(ushort)local_d98);
  local_d98._0_4_ =
       CONCAT13((0 < local_7b8._6_2_) * (local_7b8._6_2_ < 0x100) * (char)local_7b8._6_2_ -
                (0xff < local_7b8._6_2_),(uint3)local_d98);
  local_d98._0_5_ =
       CONCAT14((0 < (short)uStack_7b0) * ((short)uStack_7b0 < 0x100) * (char)(short)uStack_7b0 -
                (0xff < (short)uStack_7b0),(uint)local_d98);
  local_d98._0_6_ =
       CONCAT15((0 < uStack_7b0._2_2_) * (uStack_7b0._2_2_ < 0x100) * (char)uStack_7b0._2_2_ -
                (0xff < uStack_7b0._2_2_),(uint5)local_d98);
  local_d98._0_7_ =
       CONCAT16((0 < uStack_7b0._4_2_) * (uStack_7b0._4_2_ < 0x100) * (char)uStack_7b0._4_2_ -
                (0xff < uStack_7b0._4_2_),(uint6)local_d98);
  local_d98 = CONCAT17((0 < uStack_7b0._6_2_) * (uStack_7b0._6_2_ < 0x100) * (char)uStack_7b0._6_2_
                       - (0xff < uStack_7b0._6_2_),(uint7)local_d98);
  uStack_d90._0_2_ =
       CONCAT11((0 < local_7b8._2_2_) * (local_7b8._2_2_ < 0x100) * (char)local_7b8._2_2_ -
                (0xff < local_7b8._2_2_),
                (0 < (short)local_7b8) * ((short)local_7b8 < 0x100) * (char)(short)local_7b8 -
                (0xff < (short)local_7b8));
  uStack_d90._0_3_ =
       CONCAT12((0 < local_7b8._4_2_) * (local_7b8._4_2_ < 0x100) * (char)local_7b8._4_2_ -
                (0xff < local_7b8._4_2_),(ushort)uStack_d90);
  uStack_d90._0_4_ =
       CONCAT13((0 < local_7b8._6_2_) * (local_7b8._6_2_ < 0x100) * (char)local_7b8._6_2_ -
                (0xff < local_7b8._6_2_),(uint3)uStack_d90);
  uStack_d90._0_5_ =
       CONCAT14((0 < (short)uStack_7b0) * ((short)uStack_7b0 < 0x100) * (char)(short)uStack_7b0 -
                (0xff < (short)uStack_7b0),(uint)uStack_d90);
  uStack_d90._0_6_ =
       CONCAT15((0 < uStack_7b0._2_2_) * (uStack_7b0._2_2_ < 0x100) * (char)uStack_7b0._2_2_ -
                (0xff < uStack_7b0._2_2_),(uint5)uStack_d90);
  uStack_d90._0_7_ =
       CONCAT16((0 < uStack_7b0._4_2_) * (uStack_7b0._4_2_ < 0x100) * (char)uStack_7b0._4_2_ -
                (0xff < uStack_7b0._4_2_),(uint6)uStack_d90);
  uStack_d90 = CONCAT17((0 < uStack_7b0._6_2_) * (uStack_7b0._6_2_ < 0x100) * (char)uStack_7b0._6_2_
                        - (0xff < uStack_7b0._6_2_),(uint7)uStack_d90);
  local_198 = local_da8;
  uStack_190 = uStack_da0;
  local_1a8 = local_da8;
  uStack_1a0 = uStack_da0;
  local_da8._0_2_ =
       CONCAT11((0 < local_7d8._2_2_) * (local_7d8._2_2_ < 0x100) * (char)local_7d8._2_2_ -
                (0xff < local_7d8._2_2_),
                (0 < (short)local_7d8) * ((short)local_7d8 < 0x100) * (char)(short)local_7d8 -
                (0xff < (short)local_7d8));
  local_da8._0_3_ =
       CONCAT12((0 < local_7d8._4_2_) * (local_7d8._4_2_ < 0x100) * (char)local_7d8._4_2_ -
                (0xff < local_7d8._4_2_),(ushort)local_da8);
  local_da8._0_4_ =
       CONCAT13((0 < local_7d8._6_2_) * (local_7d8._6_2_ < 0x100) * (char)local_7d8._6_2_ -
                (0xff < local_7d8._6_2_),(uint3)local_da8);
  local_da8._0_5_ =
       CONCAT14((0 < (short)uStack_7d0) * ((short)uStack_7d0 < 0x100) * (char)(short)uStack_7d0 -
                (0xff < (short)uStack_7d0),(uint)local_da8);
  local_da8._0_6_ =
       CONCAT15((0 < uStack_7d0._2_2_) * (uStack_7d0._2_2_ < 0x100) * (char)uStack_7d0._2_2_ -
                (0xff < uStack_7d0._2_2_),(uint5)local_da8);
  local_da8._0_7_ =
       CONCAT16((0 < uStack_7d0._4_2_) * (uStack_7d0._4_2_ < 0x100) * (char)uStack_7d0._4_2_ -
                (0xff < uStack_7d0._4_2_),(uint6)local_da8);
  local_da8 = CONCAT17((0 < uStack_7d0._6_2_) * (uStack_7d0._6_2_ < 0x100) * (char)uStack_7d0._6_2_
                       - (0xff < uStack_7d0._6_2_),(uint7)local_da8);
  uStack_da0._0_2_ =
       CONCAT11((0 < local_7d8._2_2_) * (local_7d8._2_2_ < 0x100) * (char)local_7d8._2_2_ -
                (0xff < local_7d8._2_2_),
                (0 < (short)local_7d8) * ((short)local_7d8 < 0x100) * (char)(short)local_7d8 -
                (0xff < (short)local_7d8));
  uStack_da0._0_3_ =
       CONCAT12((0 < local_7d8._4_2_) * (local_7d8._4_2_ < 0x100) * (char)local_7d8._4_2_ -
                (0xff < local_7d8._4_2_),(ushort)uStack_da0);
  uStack_da0._0_4_ =
       CONCAT13((0 < local_7d8._6_2_) * (local_7d8._6_2_ < 0x100) * (char)local_7d8._6_2_ -
                (0xff < local_7d8._6_2_),(uint3)uStack_da0);
  uStack_da0._0_5_ =
       CONCAT14((0 < (short)uStack_7d0) * ((short)uStack_7d0 < 0x100) * (char)(short)uStack_7d0 -
                (0xff < (short)uStack_7d0),(uint)uStack_da0);
  uStack_da0._0_6_ =
       CONCAT15((0 < uStack_7d0._2_2_) * (uStack_7d0._2_2_ < 0x100) * (char)uStack_7d0._2_2_ -
                (0xff < uStack_7d0._2_2_),(uint5)uStack_da0);
  uStack_da0._0_7_ =
       CONCAT16((0 < uStack_7d0._4_2_) * (uStack_7d0._4_2_ < 0x100) * (char)uStack_7d0._4_2_ -
                (0xff < uStack_7d0._4_2_),(uint6)uStack_da0);
  uStack_da0 = CONCAT17((0 < uStack_7d0._6_2_) * (uStack_7d0._6_2_ < 0x100) * (char)uStack_7d0._6_2_
                        - (0xff < uStack_7d0._6_2_),(uint7)uStack_da0);
  local_1b8 = local_db8;
  uStack_1b0 = uStack_db0;
  local_1c8 = local_db8;
  uStack_1c0 = uStack_db0;
  local_db8._0_2_ =
       CONCAT11((0 < local_7f8._2_2_) * (local_7f8._2_2_ < 0x100) * (char)local_7f8._2_2_ -
                (0xff < local_7f8._2_2_),
                (0 < (short)local_7f8) * ((short)local_7f8 < 0x100) * (char)(short)local_7f8 -
                (0xff < (short)local_7f8));
  local_db8._0_3_ =
       CONCAT12((0 < local_7f8._4_2_) * (local_7f8._4_2_ < 0x100) * (char)local_7f8._4_2_ -
                (0xff < local_7f8._4_2_),(ushort)local_db8);
  local_db8._0_4_ =
       CONCAT13((0 < local_7f8._6_2_) * (local_7f8._6_2_ < 0x100) * (char)local_7f8._6_2_ -
                (0xff < local_7f8._6_2_),(uint3)local_db8);
  local_db8._0_5_ =
       CONCAT14((0 < (short)uStack_7f0) * ((short)uStack_7f0 < 0x100) * (char)(short)uStack_7f0 -
                (0xff < (short)uStack_7f0),(uint)local_db8);
  local_db8._0_6_ =
       CONCAT15((0 < uStack_7f0._2_2_) * (uStack_7f0._2_2_ < 0x100) * (char)uStack_7f0._2_2_ -
                (0xff < uStack_7f0._2_2_),(uint5)local_db8);
  local_db8._0_7_ =
       CONCAT16((0 < uStack_7f0._4_2_) * (uStack_7f0._4_2_ < 0x100) * (char)uStack_7f0._4_2_ -
                (0xff < uStack_7f0._4_2_),(uint6)local_db8);
  local_db8 = CONCAT17((0 < uStack_7f0._6_2_) * (uStack_7f0._6_2_ < 0x100) * (char)uStack_7f0._6_2_
                       - (0xff < uStack_7f0._6_2_),(uint7)local_db8);
  uStack_db0._0_2_ =
       CONCAT11((0 < local_7f8._2_2_) * (local_7f8._2_2_ < 0x100) * (char)local_7f8._2_2_ -
                (0xff < local_7f8._2_2_),
                (0 < (short)local_7f8) * ((short)local_7f8 < 0x100) * (char)(short)local_7f8 -
                (0xff < (short)local_7f8));
  uStack_db0._0_3_ =
       CONCAT12((0 < local_7f8._4_2_) * (local_7f8._4_2_ < 0x100) * (char)local_7f8._4_2_ -
                (0xff < local_7f8._4_2_),(ushort)uStack_db0);
  uStack_db0._0_4_ =
       CONCAT13((0 < local_7f8._6_2_) * (local_7f8._6_2_ < 0x100) * (char)local_7f8._6_2_ -
                (0xff < local_7f8._6_2_),(uint3)uStack_db0);
  uStack_db0._0_5_ =
       CONCAT14((0 < (short)uStack_7f0) * ((short)uStack_7f0 < 0x100) * (char)(short)uStack_7f0 -
                (0xff < (short)uStack_7f0),(uint)uStack_db0);
  uStack_db0._0_6_ =
       CONCAT15((0 < uStack_7f0._2_2_) * (uStack_7f0._2_2_ < 0x100) * (char)uStack_7f0._2_2_ -
                (0xff < uStack_7f0._2_2_),(uint5)uStack_db0);
  uStack_db0._0_7_ =
       CONCAT16((0 < uStack_7f0._4_2_) * (uStack_7f0._4_2_ < 0x100) * (char)uStack_7f0._4_2_ -
                (0xff < uStack_7f0._4_2_),(uint6)uStack_db0);
  uStack_db0 = CONCAT17((0 < uStack_7f0._6_2_) * (uStack_7f0._6_2_ < 0x100) * (char)uStack_7f0._6_2_
                        - (0xff < uStack_7f0._6_2_),(uint7)uStack_db0);
  local_1d8 = local_dc8;
  uStack_1d0 = uStack_dc0;
  local_1e8 = local_dc8;
  uStack_1e0 = uStack_dc0;
  local_dc8._0_2_ =
       CONCAT11((0 < local_818._2_2_) * (local_818._2_2_ < 0x100) * (char)local_818._2_2_ -
                (0xff < local_818._2_2_),
                (0 < (short)local_818) * ((short)local_818 < 0x100) * (char)(short)local_818 -
                (0xff < (short)local_818));
  local_dc8._0_3_ =
       CONCAT12((0 < local_818._4_2_) * (local_818._4_2_ < 0x100) * (char)local_818._4_2_ -
                (0xff < local_818._4_2_),(ushort)local_dc8);
  local_dc8._0_4_ =
       CONCAT13((0 < local_818._6_2_) * (local_818._6_2_ < 0x100) * (char)local_818._6_2_ -
                (0xff < local_818._6_2_),(uint3)local_dc8);
  local_dc8._0_5_ =
       CONCAT14((0 < (short)uStack_810) * ((short)uStack_810 < 0x100) * (char)(short)uStack_810 -
                (0xff < (short)uStack_810),(uint)local_dc8);
  local_dc8._0_6_ =
       CONCAT15((0 < uStack_810._2_2_) * (uStack_810._2_2_ < 0x100) * (char)uStack_810._2_2_ -
                (0xff < uStack_810._2_2_),(uint5)local_dc8);
  local_dc8._0_7_ =
       CONCAT16((0 < uStack_810._4_2_) * (uStack_810._4_2_ < 0x100) * (char)uStack_810._4_2_ -
                (0xff < uStack_810._4_2_),(uint6)local_dc8);
  local_dc8 = CONCAT17((0 < uStack_810._6_2_) * (uStack_810._6_2_ < 0x100) * (char)uStack_810._6_2_
                       - (0xff < uStack_810._6_2_),(uint7)local_dc8);
  uStack_dc0._0_2_ =
       CONCAT11((0 < local_818._2_2_) * (local_818._2_2_ < 0x100) * (char)local_818._2_2_ -
                (0xff < local_818._2_2_),
                (0 < (short)local_818) * ((short)local_818 < 0x100) * (char)(short)local_818 -
                (0xff < (short)local_818));
  uStack_dc0._0_3_ =
       CONCAT12((0 < local_818._4_2_) * (local_818._4_2_ < 0x100) * (char)local_818._4_2_ -
                (0xff < local_818._4_2_),(ushort)uStack_dc0);
  uStack_dc0._0_4_ =
       CONCAT13((0 < local_818._6_2_) * (local_818._6_2_ < 0x100) * (char)local_818._6_2_ -
                (0xff < local_818._6_2_),(uint3)uStack_dc0);
  uStack_dc0._0_5_ =
       CONCAT14((0 < (short)uStack_810) * ((short)uStack_810 < 0x100) * (char)(short)uStack_810 -
                (0xff < (short)uStack_810),(uint)uStack_dc0);
  uStack_dc0._0_6_ =
       CONCAT15((0 < uStack_810._2_2_) * (uStack_810._2_2_ < 0x100) * (char)uStack_810._2_2_ -
                (0xff < uStack_810._2_2_),(uint5)uStack_dc0);
  uStack_dc0._0_7_ =
       CONCAT16((0 < uStack_810._4_2_) * (uStack_810._4_2_ < 0x100) * (char)uStack_810._4_2_ -
                (0xff < uStack_810._4_2_),(uint6)uStack_dc0);
  uStack_dc0 = CONCAT17((0 < uStack_810._6_2_) * (uStack_810._6_2_ < 0x100) * (char)uStack_810._6_2_
                        - (0xff < uStack_810._6_2_),(uint7)uStack_dc0);
  if (local_a34 == 0) {
    local_78 = local_d98;
    uStack_70 = uStack_d90;
    local_88 = local_d98;
    uStack_80 = uStack_d90;
    local_818 = lVar26;
    uStack_810 = lVar27;
    local_808 = uVar28;
    uStack_800 = uVar29;
    local_7f8 = lVar30;
    uStack_7f0 = lVar31;
    local_7e8 = uVar32;
    uStack_7e0 = uVar33;
    local_7d8 = uVar34;
    uStack_7d0 = uVar35;
    local_7c8 = uVar36;
    uStack_7c0 = uVar37;
    local_7b8 = uVar38;
    uStack_7b0 = uVar39;
    local_7a8 = uVar40;
    uStack_7a0 = uVar41;
    local_258 = uVar50;
    local_238 = uVar51;
    local_218 = uVar52;
    local_1f8 = uVar53;
    WebPUint32ToMem((uint8_t *)local_a30,(uint)local_d98);
    local_98 = local_da8;
    uStack_90 = uStack_da0;
    local_a8 = local_da8;
    uStack_a0 = uStack_da0;
    WebPUint32ToMem((uint8_t *)(local_a30 + 4),(uint)local_da8);
    local_b8 = local_db8;
    uStack_b0 = uStack_db0;
    local_c8 = local_db8;
    uStack_c0 = uStack_db0;
    WebPUint32ToMem((uint8_t *)(local_a30 + 8),(uint)local_db8);
    local_d8 = local_dc8;
    uStack_d0 = uStack_dc0;
    local_e8 = local_dc8;
    uStack_e0 = uStack_dc0;
    WebPUint32ToMem((uint8_t *)(local_a30 + 0xc),(uint)local_dc8);
  }
  else {
    *local_a30 = local_d98;
    local_a30[4] = local_da8;
    local_a30[8] = local_db8;
    local_a30[0xc] = local_dc8;
  }
  return;
}

Assistant:

static void Transform_SSE2(const int16_t* in, uint8_t* dst, int do_two) {
  // This implementation makes use of 16-bit fixed point versions of two
  // multiply constants:
  //    K1 = sqrt(2) * cos (pi/8) ~= 85627 / 2^16
  //    K2 = sqrt(2) * sin (pi/8) ~= 35468 / 2^16
  //
  // To be able to use signed 16-bit integers, we use the following trick to
  // have constants within range:
  // - Associated constants are obtained by subtracting the 16-bit fixed point
  //   version of one:
  //      k = K - (1 << 16)  =>  K = k + (1 << 16)
  //      K1 = 85267  =>  k1 =  20091
  //      K2 = 35468  =>  k2 = -30068
  // - The multiplication of a variable by a constant become the sum of the
  //   variable and the multiplication of that variable by the associated
  //   constant:
  //      (x * K) >> 16 = (x * (k + (1 << 16))) >> 16 = ((x * k ) >> 16) + x
  const __m128i k1 = _mm_set1_epi16(20091);
  const __m128i k2 = _mm_set1_epi16(-30068);
  __m128i T0, T1, T2, T3;

  // Load and concatenate the transform coefficients (we'll do two transforms
  // in parallel). In the case of only one transform, the second half of the
  // vectors will just contain random value we'll never use nor store.
  __m128i in0, in1, in2, in3;
  {
    in0 = _mm_loadl_epi64((const __m128i*)&in[0]);
    in1 = _mm_loadl_epi64((const __m128i*)&in[4]);
    in2 = _mm_loadl_epi64((const __m128i*)&in[8]);
    in3 = _mm_loadl_epi64((const __m128i*)&in[12]);
    // a00 a10 a20 a30   x x x x
    // a01 a11 a21 a31   x x x x
    // a02 a12 a22 a32   x x x x
    // a03 a13 a23 a33   x x x x
    if (do_two) {
      const __m128i inB0 = _mm_loadl_epi64((const __m128i*)&in[16]);
      const __m128i inB1 = _mm_loadl_epi64((const __m128i*)&in[20]);
      const __m128i inB2 = _mm_loadl_epi64((const __m128i*)&in[24]);
      const __m128i inB3 = _mm_loadl_epi64((const __m128i*)&in[28]);
      in0 = _mm_unpacklo_epi64(in0, inB0);
      in1 = _mm_unpacklo_epi64(in1, inB1);
      in2 = _mm_unpacklo_epi64(in2, inB2);
      in3 = _mm_unpacklo_epi64(in3, inB3);
      // a00 a10 a20 a30   b00 b10 b20 b30
      // a01 a11 a21 a31   b01 b11 b21 b31
      // a02 a12 a22 a32   b02 b12 b22 b32
      // a03 a13 a23 a33   b03 b13 b23 b33
    }
  }

  // Vertical pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i a = _mm_add_epi16(in0, in2);
    const __m128i b = _mm_sub_epi16(in0, in2);
    // c = MUL(in1, K2) - MUL(in3, K1) = MUL(in1, k2) - MUL(in3, k1) + in1 - in3
    const __m128i c1 = _mm_mulhi_epi16(in1, k2);
    const __m128i c2 = _mm_mulhi_epi16(in3, k1);
    const __m128i c3 = _mm_sub_epi16(in1, in3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(in1, K1) + MUL(in3, K2) = MUL(in1, k1) + MUL(in3, k2) + in1 + in3
    const __m128i d1 = _mm_mulhi_epi16(in1, k1);
    const __m128i d2 = _mm_mulhi_epi16(in3, k2);
    const __m128i d3 = _mm_add_epi16(in1, in3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&tmp0, &tmp1, &tmp2, &tmp3, &T0, &T1, &T2, &T3);
  }

  // Horizontal pass and subsequent transpose.
  {
    // First pass, c and d calculations are longer because of the "trick"
    // multiplications.
    const __m128i four = _mm_set1_epi16(4);
    const __m128i dc = _mm_add_epi16(T0, four);
    const __m128i a =  _mm_add_epi16(dc, T2);
    const __m128i b =  _mm_sub_epi16(dc, T2);
    // c = MUL(T1, K2) - MUL(T3, K1) = MUL(T1, k2) - MUL(T3, k1) + T1 - T3
    const __m128i c1 = _mm_mulhi_epi16(T1, k2);
    const __m128i c2 = _mm_mulhi_epi16(T3, k1);
    const __m128i c3 = _mm_sub_epi16(T1, T3);
    const __m128i c4 = _mm_sub_epi16(c1, c2);
    const __m128i c = _mm_add_epi16(c3, c4);
    // d = MUL(T1, K1) + MUL(T3, K2) = MUL(T1, k1) + MUL(T3, k2) + T1 + T3
    const __m128i d1 = _mm_mulhi_epi16(T1, k1);
    const __m128i d2 = _mm_mulhi_epi16(T3, k2);
    const __m128i d3 = _mm_add_epi16(T1, T3);
    const __m128i d4 = _mm_add_epi16(d1, d2);
    const __m128i d = _mm_add_epi16(d3, d4);

    // Second pass.
    const __m128i tmp0 = _mm_add_epi16(a, d);
    const __m128i tmp1 = _mm_add_epi16(b, c);
    const __m128i tmp2 = _mm_sub_epi16(b, c);
    const __m128i tmp3 = _mm_sub_epi16(a, d);
    const __m128i shifted0 = _mm_srai_epi16(tmp0, 3);
    const __m128i shifted1 = _mm_srai_epi16(tmp1, 3);
    const __m128i shifted2 = _mm_srai_epi16(tmp2, 3);
    const __m128i shifted3 = _mm_srai_epi16(tmp3, 3);

    // Transpose the two 4x4.
    VP8Transpose_2_4x4_16b(&shifted0, &shifted1, &shifted2, &shifted3, &T0, &T1,
                           &T2, &T3);
  }

  // Add inverse transform to 'dst' and store.
  {
    const __m128i zero = _mm_setzero_si128();
    // Load the reference(s).
    __m128i dst0, dst1, dst2, dst3;
    if (do_two) {
      // Load eight bytes/pixels per line.
      dst0 = _mm_loadl_epi64((__m128i*)(dst + 0 * BPS));
      dst1 = _mm_loadl_epi64((__m128i*)(dst + 1 * BPS));
      dst2 = _mm_loadl_epi64((__m128i*)(dst + 2 * BPS));
      dst3 = _mm_loadl_epi64((__m128i*)(dst + 3 * BPS));
    } else {
      // Load four bytes/pixels per line.
      dst0 = _mm_cvtsi32_si128(WebPMemToUint32(dst + 0 * BPS));
      dst1 = _mm_cvtsi32_si128(WebPMemToUint32(dst + 1 * BPS));
      dst2 = _mm_cvtsi32_si128(WebPMemToUint32(dst + 2 * BPS));
      dst3 = _mm_cvtsi32_si128(WebPMemToUint32(dst + 3 * BPS));
    }
    // Convert to 16b.
    dst0 = _mm_unpacklo_epi8(dst0, zero);
    dst1 = _mm_unpacklo_epi8(dst1, zero);
    dst2 = _mm_unpacklo_epi8(dst2, zero);
    dst3 = _mm_unpacklo_epi8(dst3, zero);
    // Add the inverse transform(s).
    dst0 = _mm_add_epi16(dst0, T0);
    dst1 = _mm_add_epi16(dst1, T1);
    dst2 = _mm_add_epi16(dst2, T2);
    dst3 = _mm_add_epi16(dst3, T3);
    // Unsigned saturate to 8b.
    dst0 = _mm_packus_epi16(dst0, dst0);
    dst1 = _mm_packus_epi16(dst1, dst1);
    dst2 = _mm_packus_epi16(dst2, dst2);
    dst3 = _mm_packus_epi16(dst3, dst3);
    // Store the results.
    if (do_two) {
      // Store eight bytes/pixels per line.
      _mm_storel_epi64((__m128i*)(dst + 0 * BPS), dst0);
      _mm_storel_epi64((__m128i*)(dst + 1 * BPS), dst1);
      _mm_storel_epi64((__m128i*)(dst + 2 * BPS), dst2);
      _mm_storel_epi64((__m128i*)(dst + 3 * BPS), dst3);
    } else {
      // Store four bytes/pixels per line.
      WebPUint32ToMem(dst + 0 * BPS, _mm_cvtsi128_si32(dst0));
      WebPUint32ToMem(dst + 1 * BPS, _mm_cvtsi128_si32(dst1));
      WebPUint32ToMem(dst + 2 * BPS, _mm_cvtsi128_si32(dst2));
      WebPUint32ToMem(dst + 3 * BPS, _mm_cvtsi128_si32(dst3));
    }
  }
}